

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

UpsampleLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::UpsampleLayerParams>
          (Arena *arena)

{
  UpsampleLayerParams *pUVar1;
  
  if (arena != (Arena *)0x0) {
    pUVar1 = DoCreateMessage<CoreML::Specification::UpsampleLayerParams>(arena);
    return pUVar1;
  }
  pUVar1 = (UpsampleLayerParams *)operator_new(0x48);
  CoreML::Specification::UpsampleLayerParams::UpsampleLayerParams(pUVar1,(Arena *)0x0,false);
  return pUVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }